

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmissionSystem.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::EmissionSystem::SetEmitterBeams
          (EmissionSystem *this,
          vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_> *Beams
          )

{
  bool bVar1;
  KUINT8 KVar2;
  size_type sVar3;
  pointer this_00;
  __normal_iterator<KDIS::DATA_TYPE::EmitterBeam_*,_std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>_>
  local_38;
  __normal_iterator<const_KDIS::DATA_TYPE::EmitterBeam_*,_std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>_>
  local_30;
  const_iterator citrEnd;
  __normal_iterator<const_KDIS::DATA_TYPE::EmitterBeam_*,_std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>_>
  local_20;
  const_iterator citr;
  vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_> *Beams_local;
  EmissionSystem *this_local;
  
  citr._M_current = (EmitterBeam *)Beams;
  std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>::
  operator=(&this->m_vEmitterBeams,Beams);
  sVar3 = std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>::
          size(&this->m_vEmitterBeams);
  this->m_ui8NumberOfBeams = (KUINT8)sVar3;
  this->m_ui8SystemDataLength = '\x05';
  citrEnd._M_current =
       (EmitterBeam *)
       std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>::
       begin(&this->m_vEmitterBeams);
  __gnu_cxx::
  __normal_iterator<KDIS::DATA_TYPE::EmitterBeam_const*,std::vector<KDIS::DATA_TYPE::EmitterBeam,std::allocator<KDIS::DATA_TYPE::EmitterBeam>>>
  ::__normal_iterator<KDIS::DATA_TYPE::EmitterBeam*>
            ((__normal_iterator<KDIS::DATA_TYPE::EmitterBeam_const*,std::vector<KDIS::DATA_TYPE::EmitterBeam,std::allocator<KDIS::DATA_TYPE::EmitterBeam>>>
              *)&local_20,
             (__normal_iterator<KDIS::DATA_TYPE::EmitterBeam_*,_std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>_>
              *)&citrEnd);
  local_38._M_current =
       (EmitterBeam *)
       std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>::end
                 (&this->m_vEmitterBeams);
  __gnu_cxx::
  __normal_iterator<KDIS::DATA_TYPE::EmitterBeam_const*,std::vector<KDIS::DATA_TYPE::EmitterBeam,std::allocator<KDIS::DATA_TYPE::EmitterBeam>>>
  ::__normal_iterator<KDIS::DATA_TYPE::EmitterBeam*>
            ((__normal_iterator<KDIS::DATA_TYPE::EmitterBeam_const*,std::vector<KDIS::DATA_TYPE::EmitterBeam,std::allocator<KDIS::DATA_TYPE::EmitterBeam>>>
              *)&local_30,&local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::DATA_TYPE::EmitterBeam_*,_std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>_>
              ::operator->(&local_20);
    KVar2 = EmitterBeam::GetBeamDataLength(this_00);
    this->m_ui8SystemDataLength = this->m_ui8SystemDataLength + KVar2;
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::EmitterBeam_*,_std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void EmissionSystem::SetEmitterBeams( const vector<EmitterBeam> & Beams )
{
    m_vEmitterBeams = Beams;
    m_ui8NumberOfBeams = m_vEmitterBeams.size();

    // Re-Calculate the System Data Length
    m_ui8SystemDataLength = EMISSION_SYSTEM_SIZE / 4;

    vector<EmitterBeam>::const_iterator citr = m_vEmitterBeams.begin();
    vector<EmitterBeam>::const_iterator citrEnd = m_vEmitterBeams.end();

    for( ; citr != citrEnd; ++citr )
    {
        m_ui8SystemDataLength += citr->GetBeamDataLength();
    }
}